

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::Compiler::getAllSourceInfo
          (Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Orphanage orphanage)

{
  Orphanage orphanage_00;
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  undefined1 local_38 [24];
  Compiler *this_local;
  Orphanage orphanage_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (Compiler *)orphanage.arena;
  local_38._16_8_ = this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_38,
             &this->impl);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_38
                      );
  this_01 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  orphanage_00.capTable = (CapTableBuilder *)orphanage_local.arena;
  orphanage_00.arena = (BuilderArena *)this_local;
  Impl::getAllSourceInfo(__return_storage_ptr__,this_01,orphanage_00);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Node::SourceInfo>> Compiler::getAllSourceInfo(Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getAllSourceInfo(orphanage);
}